

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall pugi::xml_document::document_element(xml_document *this)

{
  long *in_RDI;
  xml_node_struct *i;
  xml_node_struct *local_18;
  xml_node local_8;
  
  local_18 = *(xml_node_struct **)(*in_RDI + 0x20);
  while( true ) {
    if (local_18 == (xml_node_struct *)0x0) {
      xml_node::xml_node(&local_8);
      return (xml_node)local_8._root;
    }
    if (((uint)local_18->header & 0xf) == 2) break;
    local_18 = local_18->next_sibling;
  }
  xml_node::xml_node(&local_8,local_18);
  return (xml_node)local_8._root;
}

Assistant:

PUGI__FN xml_node xml_document::document_element() const
	{
		assert(_root);

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			if (PUGI__NODETYPE(i) == node_element)
				return xml_node(i);

		return xml_node();
	}